

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileMutator.cpp
# Opt level: O0

DynamicProfileMutator * DynamicProfileMutator::GetMutator(void)

{
  bool bVar1;
  char16 *pcVar2;
  HMODULE hModule_00;
  FARPROC p_Var3;
  DynamicProfileMutator *mutator;
  CreateMutatorFunc procAddress;
  HMODULE hModule;
  char16 *dllname;
  
  bVar1 = Js::ConfigFlagsTable::IsEnabled
                    ((ConfigFlagsTable *)&Js::Configuration::Global,DynamicProfileMutatorFlag);
  if (bVar1) {
    pcVar2 = Js::String::operator_cast_to_char16_t_((String *)&DAT_01ea4130);
    hModule_00 = LoadLibraryW(pcVar2);
    if (hModule_00 == (HMODULE)0x0) {
      Output::Print(L"ERROR: Unable to load dynamic profile mutator dll %s\n",pcVar2);
      Js::Throw::FatalInternalError(-0x7fffbffb);
    }
    p_Var3 = GetProcAddress(hModule_00,"CreateDynamicProfileMutator");
    if (p_Var3 == (FARPROC)0x0) {
      Output::Print(L"ERROR: Unable to get function %S from dll %s\n","CreateDynamicProfileMutator",
                    pcVar2);
      Js::Throw::FatalInternalError(-0x7fffbffb);
    }
    dllname = (char16 *)(*p_Var3)();
    if (dllname == (char16 *)0x0) {
      Output::Print(L"ERROR: Failed to create mutator from dll %s\n",pcVar2);
      Js::Throw::FatalInternalError(-0x7fffbffb);
    }
    pcVar2 = Js::String::operator_cast_to_char16_t_((String *)&DAT_01ea4138);
    (**(code **)(*(long *)dllname + 0x10))(dllname,pcVar2);
  }
  else {
    dllname = (char16 *)0x0;
  }
  return (DynamicProfileMutator *)dllname;
}

Assistant:

DynamicProfileMutator *
DynamicProfileMutator::GetMutator()
{
    if (!Js::Configuration::Global.flags.IsEnabled(Js::DynamicProfileMutatorFlag))
    {
        return nullptr;
    }

    char16 const * dllname = Js::Configuration::Global.flags.DynamicProfileMutatorDll;
    HMODULE hModule = ::LoadLibraryW(dllname);
    if (hModule == nullptr)
    {
        Output::Print(_u("ERROR: Unable to load dynamic profile mutator dll %s\n"), dllname);
        Js::Throw::FatalInternalError();
    }

    CreateMutatorFunc procAddress = (CreateMutatorFunc)::GetProcAddress(hModule, CreateMutatorProcName);

    if (procAddress == nullptr)
    {
        Output::Print(_u("ERROR: Unable to get function %S from dll %s\n"), CreateMutatorProcName, dllname);
        Js::Throw::FatalInternalError();
    }

    DynamicProfileMutator * mutator = procAddress();
    if (mutator == nullptr)
    {
        Output::Print(_u("ERROR: Failed to create mutator from dll %s\n"), dllname);
        Js::Throw::FatalInternalError();
    }
    mutator->Initialize(Js::Configuration::Global.flags.DynamicProfileMutator);
    return mutator;
}